

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

bool chrono::utils::AddTriangleMeshConvexDecomposition
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,string *obj_filename,
               string *name,ChVector<double> *pos,ChQuaternion<double> *rot,float skin_thickness,
               bool use_original_asset,shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _func_int *p_Var5;
  element_type *peVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  undefined8 uVar10;
  bool bVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ostream *this;
  ChTriangleMeshShape *this_00;
  _func_int **pp_Var13;
  long lVar14;
  pointer *size;
  size_t size_00;
  uint hullIndex;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape_1;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> convexhull;
  ChConvexDecompositionHACDv2 decomposition;
  stringstream ss;
  ChTriangleMeshShape *local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  ChBody *local_3e8;
  uint local_3dc;
  string *local_3d8;
  ChQuaternion<double> *local_3d0;
  undefined1 local_3c8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  pointer pCStack_3a8;
  pointer local_3a0;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_398;
  shared_ptr<chrono::ChVisualShape> local_378;
  shared_ptr<chrono::ChVisualMaterial> local_368;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_358;
  shared_ptr<chrono::ChVisualShape> local_348;
  shared_ptr<chrono::ChVisualMaterial> local_338;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_328;
  pointer local_318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_310;
  shared_ptr<chrono::ChVisualModel> local_308;
  _func_int **local_2f8;
  _func_int **local_2f0;
  _Alloc_hider local_2e8;
  ChVector<double> *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c8;
  ChFrame<double> local_2c0;
  ChConvexDecompositionHACDv2 local_238;
  undefined1 local_1b8 [16];
  double dStack_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double dStack_188;
  double local_180;
  undefined1 local_178 [328];
  
  local_3e8 = body;
  local_3d8 = name;
  local_3d0 = rot;
  local_2d8._M_allocated_capacity = (size_type)material;
  ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
  uVar10 = local_1b8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
  }
  if ((_func_int **)uVar10 == (_func_int **)0x0) {
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var12->_M_use_count = 1;
    p_Var12->_M_weak_count = 1;
    p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
    local_308.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var12 + 1);
    p_Var12[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[1]._M_use_count = 0;
    p_Var12[1]._M_weak_count = 0;
    p_Var12[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[2]._M_use_count = 0;
    p_Var12[2]._M_weak_count = 0;
    p_Var12[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[2]._M_use_count = 0;
    p_Var12[2]._M_weak_count = 0;
    p_Var12[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[3]._M_use_count = 0;
    p_Var12[3]._M_weak_count = 0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var12->_M_use_count = 2;
    }
    local_308.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var12;
    ChPhysicsItem::AddVisualModel(&local_3e8->super_ChPhysicsItem,&local_308);
    if (local_308.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_308.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
  }
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_3c8,obj_filename,true,false);
  if ((_func_int **)local_3c8._0_8_ == (_func_int **)0x0) {
    bVar7 = false;
  }
  else {
    lVar14 = (long)(((ChTriangleMesh *)(local_3c8._0_8_ + 0x10))->super_ChGeometry)._vptr_ChGeometry
             - (long)(((ChTriangleMesh *)(local_3c8._0_8_ + 8))->super_ChGeometry)._vptr_ChGeometry;
    if (lVar14 != 0) {
      lVar14 = (lVar14 >> 3) * -0x5555555555555555;
      lVar14 = lVar14 + (ulong)(lVar14 == 0);
      pp_Var13 = (((ChTriangleMesh *)(local_3c8._0_8_ + 8))->super_ChGeometry)._vptr_ChGeometry + 2;
      auVar15 = ZEXT816(0xbff0000000000000);
      auVar16 = ZEXT816(0x4000000000000000);
      do {
        dVar1 = local_3d0->m_data[0];
        dVar2 = local_3d0->m_data[1];
        dVar8 = dVar1 * dVar1;
        dVar3 = local_3d0->m_data[2];
        dVar4 = local_3d0->m_data[3];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar8 + dVar2 * dVar2;
        auVar21 = vfmadd213sd_fma(auVar21,auVar16,auVar15);
        dVar9 = dVar2 * dVar3 - dVar4 * dVar1;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = pp_Var13[-2];
        p_Var5 = pp_Var13[-1];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = (double)p_Var5 * (dVar9 + dVar9);
        auVar21 = vfmadd231sd_fma(auVar26,auVar27,auVar21);
        dVar9 = dVar1 * dVar3 + dVar4 * dVar2;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *pp_Var13;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar9 + dVar9;
        auVar21 = vfmadd213sd_fma(auVar22,auVar28,auVar21);
        dVar9 = dVar2 * dVar3 + dVar4 * dVar1;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar8 + dVar3 * dVar3;
        auVar22 = vfmadd213sd_fma(auVar24,auVar16,auVar15);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar9 + dVar9;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = (double)p_Var5 * auVar22._0_8_;
        auVar22 = vfmadd231sd_fma(auVar25,auVar27,auVar17);
        dVar9 = dVar4 * dVar3 - dVar1 * dVar2;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar9 + dVar9;
        auVar22 = vfmadd213sd_fma(auVar18,auVar28,auVar22);
        dVar9 = dVar4 * dVar2 - dVar1 * dVar3;
        dVar1 = dVar1 * dVar2 + dVar4 * dVar3;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar9 + dVar9;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = (double)p_Var5 * (dVar1 + dVar1);
        auVar18 = vfmadd231sd_fma(auVar23,auVar27,auVar19);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar4 * dVar4 + dVar8;
        auVar17 = vfmadd213sd_fma(auVar20,auVar16,auVar15);
        auVar17 = vfmadd213sd_fma(auVar17,auVar28,auVar18);
        dVar1 = pos->m_data[1];
        dVar2 = pos->m_data[2];
        pp_Var13[-2] = (_func_int *)(auVar21._0_8_ + pos->m_data[0]);
        pp_Var13[-1] = (_func_int *)(auVar22._0_8_ + dVar1);
        *pp_Var13 = (_func_int *)(auVar17._0_8_ + dVar2);
        pp_Var13 = pp_Var13 + 3;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    collision::ChConvexDecompositionHACDv2::ChConvexDecompositionHACDv2(&local_238);
    collision::ChConvexDecompositionHACDv2::Reset(&local_238);
    collision::ChConvexDecompositionHACDv2::AddTriangleMesh
              (&local_238,(ChTriangleMesh *)local_3c8._0_8_);
    size = (pointer *)0x200;
    collision::ChConvexDecompositionHACDv2::SetParameters(&local_238,0x200,0x100,0x40,0.2,0.0,1e-09)
    ;
    collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition(&local_238);
    local_3dc = collision::ChConvexDecompositionHACDv2::GetHullCount(&local_238);
    local_398.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_398.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_398.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar7 = (int)local_3dc < 1;
    if (0 < (int)local_3dc) {
      local_2e8._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00b66ac8;
      local_2f0 = (_func_int **)&PTR__ChTriangleMeshConnected_00b669b8;
      local_2f8 = (_func_int **)&PTR__ChFrame_00b2b308;
      hullIndex = 0;
      local_2e0 = pos;
      do {
        collision::ChConvexDecompositionHACDv2::GetConvexHullResult(&local_238,hullIndex,&local_398)
        ;
        peVar6 = (local_3e8->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var12 = (local_3e8->collision_model).
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          }
        }
        local_318 = *(pointer *)local_2d8._M_allocated_capacity;
        local_310 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    (local_2d8._M_allocated_capacity + 8))->_M_pi;
        if (local_310 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_310->_M_use_count = local_310->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_310->_M_use_count = local_310->_M_use_count + 1;
          }
        }
        ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_1b8,local_3d0);
        size = &local_318;
        (*peVar6->_vptr_ChCollisionModel[0xf])
                  (peVar6,size,&local_398,local_2e0,(stringstream *)local_1b8);
        if (local_310 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310);
        }
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
        }
        if (!use_original_asset) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          this = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&dStack_1a8,(local_3d8->_M_dataplus)._M_p,
                            local_3d8->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(this,"_",1);
          std::ostream::operator<<(this,hullIndex);
          p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x110);
          p_Var12->_M_use_count = 1;
          p_Var12->_M_weak_count = 1;
          p_Var12->_vptr__Sp_counted_base = (_func_int **)local_2e8._M_p;
          p_Var12[1]._vptr__Sp_counted_base = local_2f0;
          p_Var12[1]._M_use_count = 0;
          p_Var12[1]._M_weak_count = 0;
          p_Var12[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[2]._M_use_count = 0;
          p_Var12[2]._M_weak_count = 0;
          p_Var12[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[3]._M_use_count = 0;
          p_Var12[3]._M_weak_count = 0;
          p_Var12[4]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[4]._M_use_count = 0;
          p_Var12[4]._M_weak_count = 0;
          p_Var12[5]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[5]._M_use_count = 0;
          p_Var12[5]._M_weak_count = 0;
          p_Var12[6]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[6]._M_use_count = 0;
          p_Var12[6]._M_weak_count = 0;
          p_Var12[7]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[7]._M_use_count = 0;
          p_Var12[7]._M_weak_count = 0;
          p_Var12[8]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[8]._M_use_count = 0;
          p_Var12[8]._M_weak_count = 0;
          p_Var12[9]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[9]._M_use_count = 0;
          p_Var12[9]._M_weak_count = 0;
          p_Var12[10]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[10]._M_use_count = 0;
          p_Var12[10]._M_weak_count = 0;
          p_Var12[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[0xb]._M_use_count = 0;
          p_Var12[0xb]._M_weak_count = 0;
          p_Var12[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[0xc]._M_use_count = 0;
          p_Var12[0xc]._M_weak_count = 0;
          p_Var12[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[0xb]._M_use_count = 0;
          p_Var12[0xb]._M_weak_count = 0;
          p_Var12[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[0xc]._M_use_count = 0;
          p_Var12[0xc]._M_weak_count = 0;
          p_Var12[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[0xd]._M_use_count = 0;
          p_Var12[0xd]._M_weak_count = 0;
          p_Var12[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var12[0xe]._M_use_count = 0;
          p_Var12[0xe]._M_weak_count = 0;
          p_Var12[0xf]._vptr__Sp_counted_base = (_func_int **)(p_Var12 + 0x10);
          p_Var12[0xf]._M_use_count = 0;
          p_Var12[0xf]._M_weak_count = 0;
          *(undefined1 *)&p_Var12[0x10]._vptr__Sp_counted_base = 0;
          size_00 = (size_t)hullIndex;
          bVar11 = collision::ChConvexDecompositionHACDv2::GetConvexHullResult
                             (&local_238,hullIndex,(ChTriangleMesh *)(p_Var12 + 1));
          if (!bVar11) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base((ios_base *)(local_178 + 0x40));
            goto LAB_0093c49b;
          }
          local_3f8 = (ChTriangleMeshShape *)
                      ChVisualShape::operator_new((ChVisualShape *)0x98,size_00);
          ChTriangleMeshShape::ChTriangleMeshShape(local_3f8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChTriangleMeshShape*>(&local_3f0,local_3f8);
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          }
          local_328.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)(p_Var12 + 1);
          local_328.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var12;
          ChTriangleMeshShape::SetMesh(local_3f8,&local_328,true);
          if (local_328.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_328.
                       super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&local_3f8->name);
          if (local_2c0._vptr_ChFrame != (_func_int **)(local_2c0.coord.pos.m_data + 1)) {
            operator_delete(local_2c0._vptr_ChFrame,(long)local_2c0.coord.pos.m_data[1] + 1);
          }
          local_338.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (vis_material->
                 super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_338.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
          if (local_338.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_338.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_338.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_338.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_338.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          ChVisualShape::AddMaterial((ChVisualShape *)local_3f8,&local_338);
          if (local_338.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_338.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          ChPhysicsItem::GetVisualModel(&local_3e8->super_ChPhysicsItem);
          uVar10 = local_2d8._8_8_;
          local_348.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_3f0._M_pi;
          if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_3f0._M_pi)->_M_use_count = (local_3f0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_3f0._M_pi)->_M_use_count = (local_3f0._M_pi)->_M_use_count + 1;
            }
          }
          local_3c8._16_8_ = (ChTriangleMeshShape *)0x3ff0000000000000;
          local_3a0 = (pointer)0x0;
          local_3b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pCStack_3a8 = (pointer)0x0;
          local_2c0._vptr_ChFrame = local_2f8;
          local_2c0.coord.pos.m_data[2] = 0.0;
          local_2c0.coord.pos.m_data[0] = 0.0;
          local_2c0.coord.pos.m_data[1] = 0.0;
          local_2c0.coord.rot.m_data[0] = 1.0;
          local_2c0.coord.rot.m_data[3] = 0.0;
          local_2c0.coord.rot.m_data[1] = 0.0;
          local_2c0.coord.rot.m_data[2] = 0.0;
          local_348.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_3f8;
          ChMatrix33<double>::ChMatrix33
                    (&local_2c0.Amatrix,(ChQuaternion<double> *)(local_3c8 + 0x10));
          ChVisualModel::AddShape((ChVisualModel *)uVar10,&local_348,&local_2c0);
          if (local_348.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_348.
                       super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_2c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8);
          }
          if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          size = (pointer *)&std::__cxx11::stringstream::VTT;
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base((ios_base *)(local_178 + 0x40));
          if (!bVar11) goto LAB_0093c49b;
        }
        hullIndex = hullIndex + 1;
        bVar7 = (int)local_3dc <= (int)hullIndex;
      } while (hullIndex != local_3dc);
    }
    if (use_original_asset) {
      this_00 = (ChTriangleMeshShape *)
                ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)size);
      ChTriangleMeshShape::ChTriangleMeshShape(this_00);
      local_3c8._16_8_ = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
                (&local_3b0,this_00);
      local_358.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_3c8._0_8_;
      local_358.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_3c8._8_8_ + 8) = *(_Atomic_word *)(local_3c8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_3c8._8_8_ + 8) = *(_Atomic_word *)(local_3c8._8_8_ + 8) + 1;
        }
      }
      ChTriangleMeshShape::SetMesh((ChTriangleMeshShape *)local_3c8._16_8_,&local_358,true);
      if (local_358.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_358.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::__cxx11::string::_M_assign((string *)(local_3c8._16_8_ + 0x40));
      local_368.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_368.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (local_368.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_368.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_368.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_368.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_368.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChVisualShape::AddMaterial((ChVisualShape *)local_3c8._16_8_,&local_368);
      if (local_368.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_368.
                   super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ChPhysicsItem::GetVisualModel(&local_3e8->super_ChPhysicsItem);
      local_378.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_3c8._16_8_;
      local_378.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_3b0._M_pi;
      if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_3b0._M_pi)->_M_use_count = (local_3b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_3b0._M_pi)->_M_use_count = (local_3b0._M_pi)->_M_use_count + 1;
        }
      }
      local_2c0._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
      local_2c0.coord.pos.m_data[0] = 0.0;
      local_2c0.coord.pos.m_data[1] = 0.0;
      local_2c0.coord.pos.m_data[2] = 0.0;
      local_1b8._0_8_ = &PTR__ChFrame_00b2b308;
      local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      dStack_1a8 = 0.0;
      local_1a0 = 0.0;
      local_198 = 1.0;
      local_190 = 0.0;
      dStack_188 = 0.0;
      local_180 = 0.0;
      ChMatrix33<double>::ChMatrix33
                ((ChMatrix33<double> *)local_178,(ChQuaternion<double> *)&local_2c0);
      ChVisualModel::AddShape((ChVisualModel *)local_3f8,&local_378,(ChFrame<double> *)local_1b8);
      if (local_378.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_378.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
      }
      if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
      }
    }
LAB_0093c49b:
    if (local_398.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_398.
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_398.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_398.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    collision::ChConvexDecompositionHACDv2::~ChConvexDecompositionHACDv2(&local_238);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_);
  }
  return bVar7;
}

Assistant:

bool AddTriangleMeshConvexDecomposition(ChBody* body,
                                        std::shared_ptr<ChMaterialSurface> material,
                                        const std::string& obj_filename,
                                        const std::string& name,
                                        const ChVector<>& pos,
                                        const ChQuaternion<>& rot,
                                        float skin_thickness,
                                        bool use_original_asset,
                                        std::shared_ptr<ChVisualMaterial> vis_material) {
    if (!body->GetVisualModel()) {
        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);
    }

    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, true, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++) {
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);
    }
    collision::ChConvexDecompositionHACDv2 decomposition;

    int hacd_maxhullcount = 512;
    int hacd_maxhullmerge = 256;
    int hacd_maxhullvertexes = 64;
    float hacd_concavity = 0.2f;
    float hacd_smallclusterthreshold = 0.0f;
    float hacd_fusetolerance = 1e-9f;

    decomposition.Reset();
    decomposition.AddTriangleMesh(*trimesh);

    decomposition.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes, hacd_concavity,
                                hacd_smallclusterthreshold, hacd_fusetolerance);
    decomposition.ComputeConvexDecomposition();

    int hull_count = decomposition.GetHullCount();
    std::vector<ChVector<double>> convexhull;
    for (int c = 0; c < hull_count; c++) {
        decomposition.GetConvexHullResult(c, convexhull);

        body->GetCollisionModel()->AddConvexHull(material, convexhull, pos, rot);
        if (!use_original_asset) {
            std::stringstream ss;
            ss << name << "_" << c;
            auto trimesh_convex = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
            if (!decomposition.GetConvexHullResult(c, *trimesh_convex))
                return false;

            auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
            trimesh_shape->SetMesh(trimesh_convex);
            trimesh_shape->SetName(ss.str());
            trimesh_shape->AddMaterial(vis_material);
            body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
        }
    }

    if (use_original_asset) {
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }

    return true;
}